

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

void __thiscall chaiscript::Type_Conversions::Type_Conversions(Type_Conversions *this)

{
  undefined8 *in_RDI;
  __integral_type_conflict in_stack_ffffffffffffffa8;
  atomic<unsigned_long> *this_00;
  
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[4] = 0;
  chaiscript::detail::threading::shared_mutex::shared_mutex((shared_mutex *)0x32901f);
  this_00 = (atomic<unsigned_long> *)(in_RDI + 5);
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  std::
  set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ::set((set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
         *)0x329046);
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  std::
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  ::set((set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
         *)0x32906d);
  std::atomic<unsigned_long>::atomic(this_00,in_stack_ffffffffffffffa8);
  chaiscript::detail::threading::
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  ::Thread_Storage((Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
                    *)(in_RDI + 0x12),in_RDI);
  chaiscript::detail::threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::
  Thread_Storage((Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> *)(in_RDI + 0x13),
                 in_RDI);
  return;
}

Assistant:

Type_Conversions()
        : m_mutex(),
          m_conversions(),
          m_convertableTypes(),
          m_num_types(0),
          m_thread_cache(this),
          m_conversion_saves(this)
      {
      }